

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext *ctx,ExprReturn *node)

{
  bool bVar1;
  TypeBase *valueType;
  ExpressionContext *pEVar2;
  LLVMValueRef pLVar3;
  TypeBase *valueType_00;
  
  pLVar3 = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  valueType = node->value->type;
  pEVar2 = ctx->ctx;
  bVar1 = ctx->currentFunctionGlobal;
  if (valueType == pEVar2->typeVoid) {
    if (bVar1 != false) {
      __assert_fail("!ctx.currentFunctionGlobal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x5b1,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)")
      ;
    }
  }
  else {
    valueType_00 = GetStackType(ctx,valueType);
    if (bVar1 == false) {
      ConvertToDataType(ctx,pLVar3,valueType_00,valueType);
    }
    else if (((valueType_00 != pEVar2->typeInt) &&
             (((valueType == (TypeBase *)0x0 || (valueType->typeID != 0x19)) &&
              (valueType_00 != pEVar2->typeLong)))) && (valueType_00 != pEVar2->typeDouble)) {
      __assert_fail("!\"unknown global return type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x5d3,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)")
      ;
    }
  }
  pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &ctx, ExprReturn *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	if(node->value->type == ctx.ctx.typeVoid)
	{
		assert(!ctx.currentFunctionGlobal);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		if(ctx.currentFunctionGlobal)
		{
			if(GetStackType(ctx, node->value->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->value->type))
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnInt"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeLong)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnLong"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeDouble)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnDouble"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				assert(!"unknown global return type");
			}
		}
		else
		{
			value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

			if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
			{
				LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				LLVMBuildRet(ctx.builder, value);
			}
		}
	}

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_return");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}